

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgesture.cpp
# Opt level: O0

void __thiscall QTapGesture::QTapGesture(QTapGesture *this,QObject *parent)

{
  QTapGesturePrivate *pQVar1;
  QGesture *in_RSI;
  QGesturePrivate *in_RDI;
  
  pQVar1 = (QTapGesturePrivate *)operator_new(0xb8);
  QTapGesturePrivate::QTapGesturePrivate(pQVar1);
  QGesture::QGesture(in_RSI,in_RDI,(QObject *)pQVar1);
  *(undefined ***)in_RDI = &PTR_metaObject_00d06de0;
  pQVar1 = d_func((QTapGesture *)0x2fc03f);
  (pQVar1->super_QGesturePrivate).gestureType = TapGesture;
  return;
}

Assistant:

QTapGesture::QTapGesture(QObject *parent)
    : QGesture(*new QTapGesturePrivate, parent)
{
    d_func()->gestureType = Qt::TapGesture;
}